

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef *macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef *names)

{
  IResultCapture *pIVar1;
  size_type sVar2;
  size_t start;
  size_t pos;
  ulong end;
  char c;
  anon_class_8_1_a855c668 trimmed;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  char local_e1;
  Capturer *local_e0;
  OfType local_d4;
  StringRef *local_d0;
  SourceLineInfo *local_c8;
  anon_class_8_1_a855c668 local_c0;
  StringRef local_b8;
  string local_a0;
  _Deque_base<char,_std::allocator<char>_> local_80;
  
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d4 = resultType;
  local_d0 = macroName;
  local_c8 = lineInfo;
  pIVar1 = getResultCapture();
  this->m_resultCapture = pIVar1;
  this->m_captured = 0;
  local_c0.names = names;
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80);
  start = 0;
  end = 0;
  do {
    if (names->m_size <= end) {
      std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
      emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,local_d0,
                 local_c8,&local_d4);
      Capturer::anon_class_8_1_a855c668::operator()(&local_b8,&local_c0,start,names->m_size - 1);
      StringRef::operator_cast_to_string(&local_a0,&local_b8);
      std::__cxx11::string::operator=
                ((string *)
                 &(this->m_messages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      StringRef::~StringRef(&local_b8);
      std::__cxx11::string::append
                ((char *)&(this->m_messages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].message);
      clara::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
      return;
    }
    local_e1 = names->m_start[end];
    if (local_e1 == '(') {
LAB_0011bdda:
      clara::std::deque<char,_std::allocator<char>_>::push_back
                ((deque<char,_std::allocator<char>_> *)&local_80,&local_e1);
    }
    else if (local_e1 == ')') {
LAB_0011bde7:
      clara::std::deque<char,_std::allocator<char>_>::pop_back
                ((deque<char,_std::allocator<char>_> *)&local_80);
    }
    else {
      if (local_e1 != ',') {
        if (local_e1 != '[') {
          if ((local_e1 == ']') || (local_e1 == '}')) goto LAB_0011bde7;
          if (local_e1 != '{') goto LAB_0011bdef;
        }
        goto LAB_0011bdda;
      }
      if (end != start) {
        sVar2 = clara::std::deque<char,_std::allocator<char>_>::size
                          ((deque<char,_std::allocator<char>_> *)&local_80);
        if (sVar2 == 0) {
          std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
          emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                    ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,local_d0,
                     local_c8,&local_d4);
          local_e0 = this;
          Capturer::anon_class_8_1_a855c668::operator()(&local_b8,&local_c0,start,end);
          StringRef::operator_cast_to_string(&local_a0,&local_b8);
          this = local_e0;
          std::__cxx11::string::operator=
                    ((string *)
                     &(local_e0->m_messages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          StringRef::~StringRef(&local_b8);
          std::__cxx11::string::append
                    ((char *)&(this->m_messages).
                              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].message);
          start = end;
        }
      }
    }
LAB_0011bdef:
    end = end + 1;
  } while( true );
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(names[start])) {
                ++start;
            }
            while (names[end] == ',' || isspace(names[end])) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case ',':
                if (start != pos && openings.size() == 0) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = trimmed(start, pos);
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.size() == 0 && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = trimmed(start, names.size() - 1);
        m_messages.back().message += " := ";
    }